

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O3

void __thiscall helics::apps::Recorder::runTo(Recorder *this,Time runToTime)

{
  element_type *peVar1;
  pointer pVVar2;
  long lVar3;
  Time currentTime;
  ostream *poVar4;
  Federate *this_00;
  pointer pVVar5;
  Recorder *this_01;
  format_string<std::__cxx11::basic_string<char>_&,_int_&,_double,_std::__cxx11::basic_string<char>_&>
  fmt;
  format_string<std::__cxx11::basic_string<char>_&,_int_&,_double,_std::__cxx11::basic_string<char>_&>
  fmt_00;
  iteration_time iVar6;
  ofstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  long local_268;
  int local_25c;
  double local_258;
  undefined8 local_250;
  long local_248;
  Recorder *local_240;
  string *local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->super_ValueFederate)._vptr_ValueFederate[-3]
      [(long)&(peVar1->super_ValueFederate).vfManager._M_t] == (_func_int)0x0) {
    (*(this->super_App)._vptr_App[2])(this);
  }
  local_238 = (string *)&this->mapfile;
  local_240 = this;
  if ((this->mapfile)._M_string_length == 0) {
    local_248 = _VTT;
    local_250 = _pthread_mutex_unlock;
  }
  else {
    std::ofstream::ofstream(&local_230,local_238,_S_out);
    pVVar5 = (this->vStat).
             super__Vector_base<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar2 = (this->vStat).
             super__Vector_base<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pVVar5 != pVVar2) {
      do {
        lVar3 = (pVVar5->time).internalTimeCode;
        local_258 = (double)(lVar3 % 1000000000) * 1e-09 + (double)(lVar3 / 1000000000);
        fmt.str.size_ = (size_t)&pVVar5->key;
        fmt.str.data_ = (char *)0xc;
        ::fmt::v11::print<std::__cxx11::string&,int&,double,std::__cxx11::string&>
                  ((v11 *)&local_230,(ostream *)"{}\t{}\t{}\t{}\n",fmt,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pVVar5->cnt
                   ,(int *)&local_258,(double *)&pVVar5->lastVal,in_stack_fffffffffffffd90);
        pVVar5 = pVVar5 + 1;
      } while (pVVar5 != pVVar2);
    }
    std::ostream::flush();
    local_230 = _VTT;
    local_248 = _VTT;
    local_250 = _pthread_mutex_unlock;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _pthread_mutex_unlock;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
  }
  lVar3 = (local_240->nextPrintTimeStep).internalTimeCode;
  local_268 = 0x7fffffffffffffff;
  if (0 < lVar3) {
    local_268 = lVar3;
  }
  local_25c = 0;
  this_01 = local_240;
  while( true ) {
    peVar1 = (this_01->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (Federate *)
              ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
              (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]);
    if (this_01->allow_iteration == true) {
      iVar6 = Federate::requestTimeIterative(this_00,runToTime,ITERATE_IF_NEEDED);
      currentTime = iVar6.grantedTime.internalTimeCode;
      if (iVar6.state == NEXT_STEP) {
        local_25c = 0;
      }
      captureForCurrentTime(this_01,currentTime,local_25c);
      local_25c = local_25c + 1;
    }
    else {
      currentTime = Federate::requestTime(this_00,runToTime);
      captureForCurrentTime(this_01,currentTime,0);
    }
    if ((this_01->mapfile)._M_string_length != 0) {
      std::ofstream::ofstream((v11 *)&local_230,local_238,_S_out);
      pVVar2 = (this_01->vStat).
               super__Vector_base<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pVVar5 = (this_01->vStat).
                    super__Vector_base<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
                    ._M_impl.super__Vector_impl_data._M_start; pVVar5 != pVVar2; pVVar5 = pVVar5 + 1
          ) {
        lVar3 = (pVVar5->time).internalTimeCode;
        local_258 = (double)(lVar3 % 1000000000) * 1e-09 + (double)(lVar3 / 1000000000);
        fmt_00.str.size_ = (size_t)&pVVar5->key;
        fmt_00.str.data_ = (char *)0xc;
        ::fmt::v11::print<std::__cxx11::string&,int&,double,std::__cxx11::string&>
                  ((v11 *)&local_230,(ostream *)"{}\t{}\t{}\t{}\n",fmt_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pVVar5->cnt
                   ,(int *)&local_258,(double *)&pVVar5->lastVal,in_stack_fffffffffffffd90);
      }
      std::ostream::flush();
      local_230 = local_248;
      *(undefined8 *)(local_228 + *(long *)(local_248 + -0x18) + -8) = local_250;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      this_01 = local_240;
    }
    if (runToTime.internalTimeCode <= currentTime.internalTimeCode) break;
    if ((local_268 <= currentTime.internalTimeCode) &&
       (0 < (this_01->nextPrintTimeStep).internalTimeCode)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"processed for time ",0x13);
      poVar4 = std::ostream::_M_insert<double>
                         ((double)(currentTime.internalTimeCode % 1000000000) * 1e-09 +
                          (double)(currentTime.internalTimeCode / 1000000000));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      local_268 = local_268 + (this_01->nextPrintTimeStep).internalTimeCode;
    }
  }
  return;
}

Assistant:

void Recorder::runTo(Time runToTime)
{
    if (fed->getCurrentMode() == Federate::Modes::STARTUP) {
        initialize();
    }

    if (!mapfile.empty()) {
        std::ofstream out(mapfile);
        for (auto& stat : vStat) {
            //    out << stat.key << "\t" << stat.cnt << '\t' << static_cast<double> (stat.time)
            //    << '\t' << stat.lastVal
            //        << '\n';
            fmt::print(out,
                       "{}\t{}\t{}\t{}\n",
                       stat.key,
                       stat.cnt,
                       static_cast<double>(stat.time),
                       stat.lastVal);
        }
        out.flush();
    }
    Time nextPrintTime = (nextPrintTimeStep > timeZero) ? nextPrintTimeStep : Time::maxVal();
    try {
        int iteration = 0;
        while (true) {
            helics::Time grantedTime;
            if (allow_iteration) {
                auto ItRes =
                    fed->requestTimeIterative(runToTime, IterationRequest::ITERATE_IF_NEEDED);
                if (ItRes.state == IterationResult::NEXT_STEP) {
                    iteration = 0;
                }
                grantedTime = ItRes.grantedTime;
                captureForCurrentTime(grantedTime, iteration);
                ++iteration;
            } else {
                grantedTime = fed->requestTime(runToTime);
                captureForCurrentTime(grantedTime);
            }
            if (!mapfile.empty()) {
                std::ofstream out(mapfile);
                for (auto& stat : vStat) {
                    fmt::print(out,
                               "{}\t{}\t{}\t{}\n",
                               stat.key,
                               stat.cnt,
                               static_cast<double>(stat.time),
                               stat.lastVal);
                }
                out.flush();
            }
            if (grantedTime >= runToTime) {
                break;
            }
            if ((grantedTime >= nextPrintTime) && (nextPrintTimeStep > timeZero)) {
                std::cout << "processed for time " << static_cast<double>(grantedTime) << "\n";
                nextPrintTime += nextPrintTimeStep;
            }
        }
    }
    catch (...) {
        std::cerr << "error generate on run\n";
    }
}